

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
mxx::scatterv_recv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t recv_size,int root,
          comm *comm)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scatterv<int>(__return_storage_ptr__,(int *)0x0,
                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,recv_size,root,
                comm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatterv_recv(size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result = scatterv((const T*)nullptr, std::vector<size_t>(), recv_size, root, comm);
    return result;
}